

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_functions.hpp
# Opt level: O0

double inefficiency_cost(Vehicle *vehicle,Full_Trajectory *trajectory,Predictions *predictions,
                        TrajectoryData data)

{
  double dVar1;
  __type _Var2;
  double multiplier;
  double pct;
  double diff;
  double target_speed;
  double speed;
  Predictions *predictions_local;
  Full_Trajectory *trajectory_local;
  Vehicle *vehicle_local;
  
  dVar1 = pow((double)(float)(vehicle->m_target_speed - data.avg_speed) / vehicle->m_target_speed,
              2.0);
  _Var2 = std::pow<int,int>(10,2);
  return dVar1 * _Var2;
}

Assistant:

double inefficiency_cost(Vehicle vehicle, Full_Trajectory trajectory, Predictions predictions, TrajectoryData data)
{
        double speed = data.avg_speed;
        double target_speed = vehicle.m_target_speed;
        double diff = target_speed - speed;
        double pct = float(diff) / target_speed;
        double multiplier = std::pow(pct,2.0);
        return multiplier * EFFICIENCY;
}